

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-keymap.c
# Opt level: O0

keypress * keymap_find(int keymap,keypress kc)

{
  keymap *local_38;
  keymap *k;
  int keymap_local;
  keycode_t kStack_18;
  keypress kc_local;
  
  if ((-1 < keymap) && (keymap < 2)) {
    local_38 = keymaps[keymap];
    while( true ) {
      if (local_38 == (keymap *)0x0) {
        return (keypress *)0x0;
      }
      kStack_18 = kc.code;
      if (((local_38->key).code == kStack_18) && ((local_38->key).mods == kc.mods)) break;
      local_38 = local_38->next;
    }
    return local_38->actions;
  }
  __assert_fail("keymap >= 0 && keymap < KEYMAP_MODE_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-keymap.c"
                ,0x3f,"const struct keypress *keymap_find(int, struct keypress)");
}

Assistant:

const struct keypress *keymap_find(int keymap, struct keypress kc)
{
	struct keymap *k;
	assert(keymap >= 0 && keymap < KEYMAP_MODE_MAX);
	for (k = keymaps[keymap]; k; k = k->next) {
		if (k->key.code == kc.code && k->key.mods == kc.mods)
			return k->actions;
	}

	return NULL;
}